

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O3

void __thiscall QColumnViewPrivate::~QColumnViewPrivate(QColumnViewPrivate *this)

{
  Data *pDVar1;
  Data *pDVar2;
  
  *(undefined ***)
   &(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.super_QFramePrivate.
    super_QWidgetPrivate = &PTR__QColumnViewPrivate_0080cec0;
  QHash<QAbstractItemView_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>
  ::~QHash(&this->viewConnections);
  std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>::~vector
            (&this->gripConnections);
  QMetaObject::Connection::~Connection(&this->animationConnection);
  QPropertyAnimation::~QPropertyAnimation(&this->currentAnimation);
  pDVar1 = (this->columnSizes).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->columnSizes).d.d)->super_QArrayData,4,0x10);
    }
  }
  pDVar2 = (this->columns).d.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->columns).d.d)->super_QArrayData,8,0x10);
    }
  }
  QAbstractItemViewPrivate::~QAbstractItemViewPrivate(&this->super_QAbstractItemViewPrivate);
  return;
}

Assistant:

QColumnViewPrivate::~QColumnViewPrivate()
{
}